

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigVec.c
# Opt level: O2

int Fraig_NodeVecPushUnique(Fraig_NodeVec_t *p,Fraig_Node_t *Entry)

{
  Fraig_Node_t **ppFVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)p->nSize;
  if (p->nSize < 1) {
    uVar2 = uVar3;
  }
  do {
    if (uVar2 == uVar3) {
      Fraig_NodeVecPush(p,Entry);
      return 0;
    }
    ppFVar1 = p->pArray + uVar3;
    uVar3 = uVar3 + 1;
  } while (*ppFVar1 != Entry);
  return 1;
}

Assistant:

int Fraig_NodeVecPushUnique( Fraig_NodeVec_t * p, Fraig_Node_t * Entry )
{
    int i;
    for ( i = 0; i < p->nSize; i++ )
        if ( p->pArray[i] == Entry )
            return 1;
    Fraig_NodeVecPush( p, Entry );
    return 0;
}